

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O3

int re2::RE2::MaxSubmatch(StringPiece *rewrite)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  if (0 < (long)rewrite->size_) {
    pcVar4 = rewrite->data_;
    pcVar3 = pcVar4 + rewrite->size_;
    uVar2 = 0;
    do {
      if ((*pcVar4 == '\\') && (pcVar4 = pcVar4 + 1, pcVar4 < pcVar3)) {
        uVar5 = (int)*pcVar4 - 0x30;
        uVar1 = uVar2;
        if ((int)uVar2 < (int)uVar5) {
          uVar1 = uVar5;
        }
        if (uVar5 < 10) {
          uVar2 = uVar1;
        }
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 < pcVar3);
    return uVar2;
  }
  return 0;
}

Assistant:

size_type size() const { return size_; }